

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grant_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::GrantMessageTest_test_to_string_Test::TestBody
          (GrantMessageTest_test_to_string_Test *this)

{
  char *message;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  bidfx_public_api::price::pixie::GrantMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Grant(granted=true, reason=)\"","access_granted.ToString()",
             (char (*) [29])"Grant(granted=true, reason=)",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/grant_message_test.cpp"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(GrantMessageTest, test_to_string)
{
    ASSERT_EQ("Grant(granted=true, reason=)", access_granted.ToString());
}